

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_rpc_server::main(json_rpc_server *this,string *param_2)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  level_type lVar4;
  ostream *poVar5;
  pointer ppVar6;
  long in_RDI;
  call_error *e;
  bad_value_cast *e_1;
  call_error *e_2;
  exception *e_3;
  iterator p;
  context *in_stack_00000208;
  json_call *in_stack_00000210;
  request *in_stack_fffffffffffffda8;
  json_rpc_server *in_stack_fffffffffffffdb0;
  json_rpc_server *in_stack_fffffffffffffdb8;
  json_rpc_server *in_stack_fffffffffffffdc0;
  application *in_stack_fffffffffffffdc8;
  undefined5 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  application *in_stack_fffffffffffffdf8;
  context *in_stack_fffffffffffffe20;
  bool local_182;
  string *in_stack_fffffffffffffe98;
  response *in_stack_fffffffffffffea0;
  _Self local_110;
  string local_108 [32];
  _Self in_stack_ffffffffffffff18;
  string local_d8 [39];
  byte local_b1;
  message local_b0 [71];
  allocator local_69;
  string local_68 [55];
  byte local_31;
  string local_30 [48];
  
  uVar3 = std::__cxx11::string::empty();
  local_31 = 0;
  local_182 = false;
  if ((uVar3 & 1) == 0) {
    application::request((application *)0x44c2b5);
    http::request::request_method_abi_cxx11_(in_stack_fffffffffffffda8);
    local_31 = 1;
    local_182 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string(local_30);
  }
  if (local_182 == false) {
    operator_new(0x60);
    application::context(in_stack_fffffffffffffdf8);
    json_call::json_call(in_stack_00000210,in_stack_00000208);
    std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::
    reset<cppcms::rpc::json_call>
              ((__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffdc0,(json_call *)in_stack_fffffffffffffdb8);
    local_b1 = 0;
    lVar4 = booster::log::logger::instance();
    bVar1 = booster::log::logger::should_be_logged(lVar4,(char *)0x46);
    if ((bVar1 & 1) != 0) {
      booster::log::message::message
                (local_b0,debug,"cppcms",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/rpc_json.cpp"
                 ,0xa2);
      local_b1 = 1;
      poVar5 = (ostream *)booster::log::message::out();
      poVar5 = std::operator<<(poVar5,"JSON-RPC Method call:");
      method_abi_cxx11_(in_stack_fffffffffffffdb8);
      poVar5 = std::operator<<(poVar5,local_d8);
      std::ios::operator_cast_to_bool(poVar5 + *(long *)(*(long *)poVar5 + -0x18));
      std::__cxx11::string::~string(local_d8);
    }
    if ((local_b1 & 1) != 0) {
      booster::log::message::~message(local_b0);
    }
    method_abi_cxx11_(in_stack_fffffffffffffdb8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
    ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
            *)in_stack_fffffffffffffda8,(key_type *)0x44c6a2);
    std::__cxx11::string::~string(local_108);
    local_110._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
                *)in_stack_fffffffffffffda8);
    bVar2 = std::operator==((_Self *)&stack0xffffffffffffff18,&local_110);
    if (bVar2) {
      bVar2 = notification(in_stack_fffffffffffffdb0);
      if (!bVar2) {
        json::value::value<char[17]>
                  ((value *)in_stack_fffffffffffffdc0,(char (*) [17])in_stack_fffffffffffffdb8);
        return_error(in_stack_fffffffffffffdc0,(value *)in_stack_fffffffffffffdb8);
        json::value::~value((value *)0x44c755);
      }
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
                             *)0x44c85a);
      if (((ppVar6->second).role != notification_role) ||
         (bVar2 = notification(in_stack_fffffffffffffdb0), bVar2)) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
                               *)0x44c8f3);
        if (((ppVar6->second).role != method_role) ||
           (bVar2 = notification(in_stack_fffffffffffffdb0), !bVar2)) {
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>
                        *)0x44c928);
          params(in_stack_fffffffffffffdb0);
          std::
          function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
          ::operator()((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
                        *)in_stack_fffffffffffffdb0,
                       (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)
                       in_stack_fffffffffffffda8);
        }
      }
      else {
        json::value::value<char[35]>
                  ((value *)in_stack_fffffffffffffdc0,(char (*) [35])in_stack_fffffffffffffdb8);
        return_error(in_stack_fffffffffffffdc0,(value *)in_stack_fffffffffffffdb8);
        json::value::~value((value *)0x44c8bb);
      }
    }
  }
  else {
    application::response((application *)0x44c346);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"application/json",&local_69);
    http::response::set_content_header(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    application::response((application *)0x44c3bf);
    poVar5 = http::response::out((response *)in_stack_ffffffffffffff18._M_node);
    std::operator<<(poVar5,(string *)(in_RDI + 0x68));
    bVar2 = application::is_asynchronous(in_stack_fffffffffffffdc8);
    if (bVar2) {
      application::release_context
                ((application *)
                 CONCAT17(in_stack_fffffffffffffdef,
                          CONCAT16(in_stack_fffffffffffffdee,
                                   CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8))));
      std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x44c41b);
      http::context::async_complete_response(in_stack_fffffffffffffe20);
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x44c432);
    }
  }
  return;
}

Assistant:

void json_rpc_server::main(std::string /*unused*/)
	{
		if(!smd_.empty() && request().request_method()=="GET") {

			response().set_content_header("application/json");
			response().out() << smd_;

			if(is_asynchronous())
				release_context()->async_complete_response();
			return;
		}

		try {
			current_call_.reset(new json_call(context()));
			BOOSTER_DEBUG("cppcms") << "JSON-RPC Method call:" << method();
			methods_map_type::iterator p=methods_.find(method());
			if(p==methods_.end()) {
				if(!notification())
					return_error("Method not found");
				return;
			}
			if(p->second.role == notification_role && !notification()) {
				return_error("The request should be notification");
				return;
			}
			if(p->second.role == method_role && notification()) {
				// No way to respond according to protocol
				return;
			}
			try {
				p->second.method(params());
			}
			catch(json::bad_value_cast const &e) {
				if(current_call_.get() && !notification())
					return_error("Invalid parameters");
				return;
			}
			catch(call_error const &e) {
				if(current_call_.get() && !notification())
					return_error(e.what());
				return;
			}
			catch(std::exception const &e) {
				if(current_call_.get() && !notification())
					return_error("Internal Service Error");
				return;
			}
		}
		catch(call_error const &e)
		{
			response().set_content_header("text/plain");
			response().out()<< e.what() << std::endl;
		}
	}